

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<3UL>::GetAttributesWithPropertyIndex
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance,PropertyId propertyId,
          BigPropertyIndex index,PropertyAttributes *attributes)

{
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  PropertyRecord *this_00;
  undefined4 *puVar4;
  PropertyAttributes *attributes_local;
  BigPropertyIndex index_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<3UL> *this_local;
  
  if (index < this->propertyCount) {
    this_00 = Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator->
                        (&this->descriptors[index].Id);
    PVar3 = PropertyRecord::GetPropertyId(this_00);
    if (PVar3 != propertyId) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                  ,0x440,"(descriptors[index].Id->GetPropertyId() == propertyId)",
                                  "descriptors[index].Id->GetPropertyId() == propertyId");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if ((this->descriptors[index].field_1.Attributes & 8) == 0) {
      *attributes = this->descriptors[index].field_1.Attributes & 7;
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleTypeHandler<size>::GetAttributesWithPropertyIndex(DynamicObject * instance, PropertyId propertyId, BigPropertyIndex index, PropertyAttributes * attributes)
    {
        if (index >= propertyCount) { return false; }
        Assert(descriptors[index].Id->GetPropertyId() == propertyId);
        if (descriptors[index].Attributes & PropertyDeleted)
        {
            return false;
        }
        *attributes = descriptors[index].Attributes & PropertyDynamicTypeDefaults;
        return true;
    }